

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O1

void __thiscall
Finger::Finger(Finger *this,Vec4i *defect,
              vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *cnt,Rect *boundingBox,
              int maxAngle,bool shouldCheckAngles,bool shouldCheckDist,int index)

{
  int iVar1;
  int iVar2;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_30;
  
  (this->ptStart).x = 0;
  (this->ptStart).y = 0;
  (this->ptEnd).x = 0;
  (this->ptEnd).y = 0;
  (this->ptFar).x = 0;
  (this->ptFar).y = 0;
  this->maxAngle = (float)maxAngle;
  this->minDepth = 0xb;
  this->ok = false;
  this->shouldCheckAngles = shouldCheckAngles;
  this->shouldCheckDist = shouldCheckDist;
  this->index = index;
  this->hndAngle = -1;
  (this->boundingBox).x = boundingBox->x;
  (this->boundingBox).y = boundingBox->y;
  (this->boundingBox).width = boundingBox->width;
  (this->boundingBox).height = boundingBox->height;
  iVar1 = (defect->super_Matx<int,_4,_1>).val[3];
  iVar2 = iVar1 + 0xff;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  this->depth = (float)(iVar2 >> 8);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_30,cnt);
  iVar1 = (defect->super_Matx<int,_4,_1>).val[2];
  iVar2 = (defect->super_Matx<int,_4,_1>).val[1];
  this->ptStart =
       local_30.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
       super__Vector_impl_data._M_start[(defect->super_Matx<int,_4,_1>).val[0]];
  this->ptEnd = local_30.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar2];
  this->ptFar = local_30.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar1];
  if (local_30.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  check(this);
  return;
}

Assistant:

Finger::Finger(const Vec4i &defect, const vector<Point> &cnt, const Rect &boundingBox, int maxAngle,
               bool shouldCheckAngles, bool shouldCheckDist, int index)
        : boundingBox(boundingBox), maxAngle(maxAngle), shouldCheckAngles(shouldCheckAngles),
          shouldCheckDist(shouldCheckDist), index(index) {
    depth = defect[3] / 256;
    getPoints(cnt, defect);
    check();
}